

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_chain_t * ngx_alloc_chain_link(ngx_pool_t *pool)

{
  ngx_chain_t *cl;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)pool->chain;
  if (pool_local == (ngx_pool_t *)0x0) {
    pool_local = (ngx_pool_t *)ngx_palloc(pool,0x10);
    if (pool_local == (ngx_pool_t *)0x0) {
      pool_local = (ngx_pool_t *)0x0;
    }
  }
  else {
    pool->chain = (ngx_chain_t *)(pool_local->d).end;
  }
  return (ngx_chain_t *)pool_local;
}

Assistant:

ngx_chain_t *
ngx_alloc_chain_link(ngx_pool_t *pool)
{
    ngx_chain_t  *cl;

    cl = pool->chain;

    if (cl) {
        pool->chain = cl->next;
        return cl;
    }

    cl = ngx_palloc(pool, sizeof(ngx_chain_t));
    if (cl == NULL) {
        return NULL;
    }

    return cl;
}